

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O1

void __thiscall arangodb::velocypack::HexDump::~HexDump(HexDump *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->header)._M_dataplus._M_p;
  paVar2 = &(this->header).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->separator)._M_dataplus._M_p;
  paVar2 = &(this->separator).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

HexDump(Slice slice, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(slice.start()),
        length(slice.byteSize()),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}